

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

bool ExpressionRunnerSetGlobalValue
               (ExpressionRunnerRef runner,char *name,BinaryenExpressionRef value)

{
  IString *this;
  undefined1 in_CL;
  string_view sVar1;
  undefined1 local_68 [8];
  Flow setFlow;
  
  wasm::ExpressionRunner<wasm::CExpressionRunner>::visit
            ((Flow *)local_68,(ExpressionRunner<wasm::CExpressionRunner> *)runner,value);
  if (setFlow.breakTo.super_IString.str._M_len == 0) {
    this = (IString *)strlen(name);
    sVar1._M_str = (char *)0x0;
    sVar1._M_len = (size_t)name;
    sVar1 = wasm::IString::interned(this,sVar1,(bool)in_CL);
    wasm::ConstantExpressionRunner<wasm::CExpressionRunner>::setGlobalValue
              (&runner->super_ConstantExpressionRunner<wasm::CExpressionRunner>,(Name)sVar1,
               (Literals *)local_68);
  }
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &setFlow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  wasm::Literal::~Literal((Literal *)&setFlow);
  return setFlow.breakTo.super_IString.str._M_len == 0;
}

Assistant:

bool ExpressionRunnerSetGlobalValue(ExpressionRunnerRef runner,
                                    const char* name,
                                    BinaryenExpressionRef value) {
  auto* R = (CExpressionRunner*)runner;
  auto setFlow = R->visit(value);
  if (!setFlow.breaking()) {
    R->setGlobalValue(name, setFlow.values);
    return 1;
  }
  return 0;
}